

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> * __thiscall
hta::storage::file::Metric::get
          (vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *__return_storage_ptr__,
          Metric *this,TimePoint begin,TimePoint end,Duration interval,IntervalScope scope)

{
  pointer pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TimePoint TVar3;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *pvVar4;
  pointer pTVar5;
  void *pvVar6;
  void *__buf;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *__range2;
  long lVar7;
  allocator_type local_41;
  long local_40;
  HtaFile *local_38;
  
  iVar2 = (*(this->super_Metric)._vptr_Metric[0xb])(this,interval.__r);
  local_40 = CONCAT44(extraout_var,iVar2);
  if (local_40 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  local_38 = file_hta(this,interval);
  if ((((long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) && (scope.begin != infinity)) && (scope.end != infinity)) {
    __assert_fail("end >= begin || scope.begin == Scope::infinity || scope.end == Scope::infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                  ,0x17f,
                  "virtual std::vector<TimeAggregate> hta::storage::file::Metric::get(TimePoint, TimePoint, Duration, IntervalScope)"
                 );
  }
  TVar3 = epoch(this,interval);
  pvVar6 = (void *)0xffffffffffffffff;
  if (infinity < scope.begin) goto LAB_00114478;
  lVar7 = (long)begin.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r -
          (long)TVar3.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r;
  switch((ulong)scope & 0xffffffff) {
  case 0:
    if (-1 < lVar7) {
LAB_00114459:
      pvVar6 = (void *)(lVar7 / interval.__r + 1);
      goto LAB_00114478;
    }
    break;
  case 1:
    if (0 < lVar7) {
      lVar7 = lVar7 + -1;
      goto LAB_00114459;
    }
    break;
  case 2:
    pvVar6 = (void *)(lVar7 / interval.__r);
    goto LAB_00114478;
  }
  pvVar6 = (void *)0x0;
LAB_00114478:
  if (scope.end < 4) {
    pvVar4 = (vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
             (*(code *)(&DAT_00119d88 + *(int *)(&DAT_00119d88 + ((ulong)scope >> 0x20) * 4)))();
    return pvVar4;
  }
  __buf = (void *)0x0;
  if (0 < (long)pvVar6) {
    __buf = pvVar6;
  }
  lVar7 = -1;
  if (local_40 < -1) {
    lVar7 = local_40;
  }
  if ((((long)__buf < local_40) && (-1 < lVar7)) && ((long)pvVar6 <= lVar7)) {
    std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::vector
              (__return_storage_ptr__,(lVar7 - (long)__buf) + 1,&local_41);
    File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
              (local_38,(int)__return_storage_ptr__,__buf,0);
    pTVar5 = (__return_storage_ptr__->
             super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar1 = (__return_storage_ptr__->
             super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar5 != pTVar1) {
      lVar7 = (long)TVar3.
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r + ((long)__buf + -1) * interval.__r;
      do {
        lVar7 = lVar7 + interval.__r;
        if (lVar7 != (pTVar5->time).
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     .__d.__r) {
          __assert_fail("ta.time == t",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                        ,0x1ea,
                        "virtual std::vector<TimeAggregate> hta::storage::file::Metric::get(TimePoint, TimePoint, Duration, IntervalScope)"
                       );
        }
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 != pTVar1);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimeAggregate> Metric::get(TimePoint begin, TimePoint end, Duration interval,
                                       IntervalScope scope)
{
    auto sz = static_cast<int64_t>(size(interval));
    if (sz == 0)
    {
        return {};
    }

    HtaFile* file;
    try
    {
        file = &file_hta(interval);
    }
    catch (Exception& e)
    {
        if (e.error_number() == ENOENT)
        {
            // File does not exist... no data in this level
            // TODO handle this somehow better with meta or so
            return {};
        }
        throw;
    }

    assert(end >= begin || scope.begin == Scope::infinity || scope.end == Scope::infinity);

    auto epoch_ = epoch(interval);
    auto offset_begin = begin - epoch_;
    auto offset_end = end - epoch_;

    // We initialize so we don't get uninitialized warnings
    int64_t index_begin = -1;
    int64_t index_end = -1; // this point is **included** in the result!
    switch (scope.begin)
    {
    case Scope::closed:
        // Unfortunately division with negative numbers does *not* round down
        // so we have to make extra cases for pre-epoch
        if (offset_begin.count() <= 0)
        {
            index_begin = 0;
        }
        else
        {
            index_begin = (offset_begin - Duration(1)) / interval + 1;
        }
        break;
    case Scope::open:
        if (offset_begin.count() < 0)
        {
            index_begin = 0;
        }
        else
        {
            index_begin = offset_begin / interval + 1;
        }
        break;
    case Scope::extended:
        index_begin = offset_begin / interval;
        break;
    case Scope::infinity:
        index_begin = 0;
        break;
    }

    switch (scope.end)
    {
    case Scope::closed:
        if (offset_end.count() < 0)
        {
            index_end = -1;
        }
        else
        {
            index_end = offset_end / interval;
        }
        break;
    case Scope::open:
        if (offset_end.count() <= 0)
        {
            index_end = -1;
        }
        else
        {
            index_end = (offset_end - Duration(1)) / interval;
        }
        break;
    case Scope::extended:
        if (offset_end.count() <= 0)
        {
            index_end = 0;
        }
        else
        {
            index_end = (offset_end - Duration(1)) / interval + 1;
        }
        break;
    case Scope::infinity:
        index_end = sz - 1;
        break;
    }

    index_begin = std::max<int64_t>(index_begin, 0);
    index_end = std::min<int64_t>(index_end, sz);

    if (index_begin >= static_cast<int64_t>(sz) || index_end < 0)
    {
        return {};
    }

    assert(index_begin >= 0);
    assert(index_begin < sz);
    assert(index_end >= 0);
    assert(index_end <= sz);

    // It is possible that this happens in some strange configurations of scopes
    if (index_begin > index_end)
    {
        return {};
    }

    size_t count = index_end - index_begin + 1;

    std::vector<TimeAggregate> result(count);
    file->read(result, index_begin);

#ifndef NDEBUG
    // Check consistency of times
    TimePoint t = epoch_ + index_begin * interval;
    for (const auto& ta : result)
    {
        assert(ta.time == t);
        t += interval;
    }
#endif
    return result;
}